

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getPageNormal(Pager *pPager,Pgno pgno,DbPage **ppPage,int flags)

{
  long lVar1;
  sqlite3_pcache_page *psVar2;
  Pgno in_ECX;
  Pager *in_RDX;
  uint in_ESI;
  Pager *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  u8 noContent;
  PgHdr *pPg;
  int rc;
  sqlite3_pcache_page *pBase;
  undefined4 in_stack_ffffffffffffffb8;
  undefined3 in_stack_ffffffffffffffbc;
  undefined4 uVar4;
  Pgno pgno_00;
  sqlite3_vfs *psVar5;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffd8;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  pgno_00 = 0xaaaaaaaa;
  uVar4 = CONCAT13(0xaa,in_stack_ffffffffffffffbc);
  if (in_ESI == 0) {
    local_14 = sqlite3CorruptError(0);
    goto LAB_00161c71;
  }
  psVar2 = sqlite3PcacheFetch((PCache *)in_RDX,in_ECX,0);
  if (psVar2 == (sqlite3_pcache_page *)0x0) {
    psVar5 = (sqlite3_vfs *)0x0;
    local_14 = sqlite3PcacheFetchStress
                         ((PCache *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                          (Pgno)((ulong)in_RDX >> 0x20),
                          (sqlite3_pcache_page **)CONCAT44(in_ECX,uVar6));
    if (local_14 == 0) {
      local_14 = 7;
    }
  }
  else {
    psVar5 = (sqlite3_vfs *)
             sqlite3PcacheFetchFinish
                       ((PCache *)CONCAT44(in_ECX,uVar6),pgno_00,
                        (sqlite3_pcache_page *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
    in_RDX->pVfs = psVar5;
    bVar3 = (in_ECX & 1) != 0;
    if (((Pager *)psVar5->xOpen != (Pager *)0x0) && (!bVar3)) {
      in_RDI->aStat[0] = in_RDI->aStat[0] + 1;
      local_14 = 0;
      goto LAB_00161c71;
    }
    if (in_ESI == in_RDI->lckPgno) {
      local_14 = sqlite3CorruptError(0);
    }
    else {
      psVar5->xOpen =
           (_func_int_sqlite3_vfs_ptr_sqlite3_filename_sqlite3_file_ptr_int_int_ptr *)in_RDI;
      if (((in_RDI->fd->pMethods == (sqlite3_io_methods *)0x0) || (in_RDI->dbSize < in_ESI)) ||
         (bVar3)) {
        if (in_ESI <= in_RDI->mxPgno) {
          if (bVar3) {
            sqlite3BeginBenignMalloc();
            if (in_ESI <= in_RDI->dbOrigSize) {
              sqlite3BitvecSet((Bitvec *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                               (u32)((ulong)in_RDX >> 0x20));
            }
            addToSavepointBitvecs(in_RDX,in_ECX);
            sqlite3EndBenignMalloc();
          }
          memset(*(void **)&psVar5->mxPathname,0,in_RDI->pageSize);
          goto LAB_00161c35;
        }
        local_14 = 0xd;
        if (in_ESI <= in_RDI->dbSize) {
          sqlite3PcacheRelease((PgHdr *)0x161b9d);
          psVar5 = (sqlite3_vfs *)0x0;
        }
      }
      else {
        in_RDI->aStat[1] = in_RDI->aStat[1] + 1;
        local_14 = readDbPage((PgHdr *)in_RDI);
        if (local_14 == 0) {
LAB_00161c35:
          local_14 = 0;
          goto LAB_00161c71;
        }
      }
    }
  }
  if (psVar5 != (sqlite3_vfs *)0x0) {
    sqlite3PcacheDrop((PgHdr *)0x161c53);
  }
  pagerUnlockIfUnused((Pager *)0x161c5d);
  in_RDX->pVfs = (sqlite3_vfs *)0x0;
LAB_00161c71:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

static int getPageNormal(
  Pager *pPager,      /* The pager open on the database file */
  Pgno pgno,          /* Page number to fetch */
  DbPage **ppPage,    /* Write a pointer to the page here */
  int flags           /* PAGER_GET_XXX flags */
){
  int rc = SQLITE_OK;
  PgHdr *pPg;
  u8 noContent;                   /* True if PAGER_GET_NOCONTENT is set */
  sqlite3_pcache_page *pBase;

  assert( pPager->errCode==SQLITE_OK );
  assert( pPager->eState>=PAGER_READER );
  assert( assert_pager_state(pPager) );
  assert( pPager->hasHeldSharedLock==1 );

  if( pgno==0 ) return SQLITE_CORRUPT_BKPT;
  pBase = sqlite3PcacheFetch(pPager->pPCache, pgno, 3);
  if( pBase==0 ){
    pPg = 0;
    rc = sqlite3PcacheFetchStress(pPager->pPCache, pgno, &pBase);
    if( rc!=SQLITE_OK ) goto pager_acquire_err;
    if( pBase==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto pager_acquire_err;
    }
  }
  pPg = *ppPage = sqlite3PcacheFetchFinish(pPager->pPCache, pgno, pBase);
  assert( pPg==(*ppPage) );
  assert( pPg->pgno==pgno );
  assert( pPg->pPager==pPager || pPg->pPager==0 );

  noContent = (flags & PAGER_GET_NOCONTENT)!=0;
  if( pPg->pPager && !noContent ){
    /* In this case the pcache already contains an initialized copy of
    ** the page. Return without further ado.  */
    assert( pgno!=PAGER_SJ_PGNO(pPager) );
    pPager->aStat[PAGER_STAT_HIT]++;
    return SQLITE_OK;

  }else{
    /* The pager cache has created a new page. Its content needs to
    ** be initialized. But first some error checks:
    **
    ** (*) obsolete.  Was: maximum page number is 2^31
    ** (2) Never try to fetch the locking page
    */
    if( pgno==PAGER_SJ_PGNO(pPager) ){
      rc = SQLITE_CORRUPT_BKPT;
      goto pager_acquire_err;
    }

    pPg->pPager = pPager;

    assert( !isOpen(pPager->fd) || !MEMDB );
    if( !isOpen(pPager->fd) || pPager->dbSize<pgno || noContent ){
      if( pgno>pPager->mxPgno ){
        rc = SQLITE_FULL;
        if( pgno<=pPager->dbSize ){
          sqlite3PcacheRelease(pPg);
          pPg = 0;
        }
        goto pager_acquire_err;
      }
      if( noContent ){
        /* Failure to set the bits in the InJournal bit-vectors is benign.
        ** It merely means that we might do some extra work to journal a
        ** page that does not need to be journaled.  Nevertheless, be sure
        ** to test the case where a malloc error occurs while trying to set
        ** a bit in a bit vector.
        */
        sqlite3BeginBenignMalloc();
        if( pgno<=pPager->dbOrigSize ){
          TESTONLY( rc = ) sqlite3BitvecSet(pPager->pInJournal, pgno);
          testcase( rc==SQLITE_NOMEM );
        }
        TESTONLY( rc = ) addToSavepointBitvecs(pPager, pgno);
        testcase( rc==SQLITE_NOMEM );
        sqlite3EndBenignMalloc();
      }
      memset(pPg->pData, 0, pPager->pageSize);
      IOTRACE(("ZERO %p %d\n", pPager, pgno));
    }else{
      assert( pPg->pPager==pPager );
      pPager->aStat[PAGER_STAT_MISS]++;
      rc = readDbPage(pPg);
      if( rc!=SQLITE_OK ){
        goto pager_acquire_err;
      }
    }
    pager_set_pagehash(pPg);
  }
  return SQLITE_OK;

pager_acquire_err:
  assert( rc!=SQLITE_OK );
  if( pPg ){
    sqlite3PcacheDrop(pPg);
  }
  pagerUnlockIfUnused(pPager);
  *ppPage = 0;
  return rc;
}